

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.h
# Opt level: O0

void __thiscall
Ptex::v2_2::PtexReader::TiledFace::TiledFace
          (TiledFace *this,PtexReader *reader,Res resArg,Res tileresArg,int levelid)

{
  undefined2 in_CX;
  undefined2 in_DX;
  PtexReader *in_RDI;
  undefined4 in_R8D;
  Res unaff_retaddr;
  Res unaff_retaddr_00;
  size_type in_stack_ffffffffffffffd8;
  undefined4 in_stack_fffffffffffffff8;
  
  TiledFaceBase::TiledFaceBase
            ((TiledFaceBase *)CONCAT26(in_DX,CONCAT24(in_CX,in_stack_fffffffffffffff8)),in_RDI,
             unaff_retaddr_00,unaff_retaddr);
  (in_RDI->super_PtexTexture)._vptr_PtexTexture = (_func_int **)&PTR__TiledFace_0015fc28;
  in_RDI->_premultiply = (bool)(char)in_R8D;
  in_RDI->_ok = (bool)(char)((uint)in_R8D >> 8);
  in_RDI->_needToOpen = (bool)(char)((uint)in_R8D >> 0x10);
  in_RDI->_pendingPurge = (bool)(char)((uint)in_R8D >> 0x18);
  std::vector<Ptex::v2_2::FaceDataHeader,_std::allocator<Ptex::v2_2::FaceDataHeader>_>::vector
            ((vector<Ptex::v2_2::FaceDataHeader,_std::allocator<Ptex::v2_2::FaceDataHeader>_> *)
             0x13ac29);
  std::vector<long,_std::allocator<long>_>::vector((vector<long,_std::allocator<long>_> *)0x13ac3b);
  std::vector<Ptex::v2_2::FaceDataHeader,_std::allocator<Ptex::v2_2::FaceDataHeader>_>::resize
            ((vector<Ptex::v2_2::FaceDataHeader,_std::allocator<Ptex::v2_2::FaceDataHeader>_> *)
             CONCAT44(in_R8D,CONCAT22(in_DX,in_CX)),in_stack_ffffffffffffffd8);
  std::vector<long,_std::allocator<long>_>::resize
            ((vector<long,_std::allocator<long>_> *)CONCAT44(in_R8D,CONCAT22(in_DX,in_CX)),
             in_stack_ffffffffffffffd8);
  return;
}

Assistant:

TiledFace(PtexReader* reader, Res resArg, Res tileresArg, int levelid)
            : TiledFaceBase(reader, resArg, tileresArg),
              _levelid(levelid)
        {
            _fdh.resize(_ntiles),
            _offsets.resize(_ntiles);
        }